

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

zmsg_t * czhelp_zmsg_createv(char *picture,__va_list_tag *argptr)

{
  uint uVar1;
  char *string;
  byte *pbVar2;
  size_t sVar3;
  zmsg_t *in_RSI;
  char *in_RDI;
  binarydata dat;
  NetworkDataType *val;
  zframe_t *frame_dup;
  zmsg_t *zmsg;
  zframe_t *frame_2;
  zframe_t *frame_1;
  zhashx_t *hash;
  void *pointer;
  zuuid_t *uuid;
  zframe_t *frame;
  zchunk_t *chunk;
  byte *data;
  char *str;
  zmsg_t *msg;
  zlist_t *in_stack_fffffffffffffd18;
  zmsg_t *pzVar4;
  zlist_t *local_2d0;
  zlist_t *local_2b8;
  zlist_t *local_2a0;
  zlist_t *local_278;
  zlist_t *local_250;
  zlist_t *local_228;
  zlist_t *local_210;
  zlist_t *local_1e8;
  zlist_t *local_1d0;
  zlist_t *local_188;
  zlist_t *local_168;
  zlist_t *local_148;
  zlist_t *local_128;
  zlist_t *local_108;
  zlist_t *local_e8;
  zframe_t *local_a0;
  zmsg_t *local_98;
  zframe_t *local_90;
  zframe_t *local_88;
  zhashx_t *local_80;
  node_t *local_78;
  zuuid_t *local_70;
  zframe_t *local_68;
  zchunk_t *local_60;
  node_t *local_58;
  node_t *local_50;
  string local_38 [32];
  zmsg_t *local_18;
  zmsg_t *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = zmsg_new();
  for (; pzVar4 = local_18, *local_8 != '\0'; local_8 = local_8 + 1) {
    if (*local_8 == 'i') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_e8 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_e8 = local_10->frames;
        local_10->frames = (zlist_t *)&local_e8->tail;
      }
      zmsg_addstrf(local_18,"%d",(ulong)*(uint *)&local_e8->head);
    }
    else if (*local_8 == '1') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_108 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_108 = local_10->frames;
        local_10->frames = (zlist_t *)&local_108->tail;
      }
      zmsg_addstrf(local_18,"%u",(ulong)(*(uint *)&local_108->head & 0xff));
    }
    else if (*local_8 == '2') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_128 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_128 = local_10->frames;
        local_10->frames = (zlist_t *)&local_128->tail;
      }
      zmsg_addstrf(local_18,"%u",(ulong)(*(uint *)&local_128->head & 0xffff));
    }
    else if (*local_8 == '4') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_148 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_148 = local_10->frames;
        local_10->frames = (zlist_t *)&local_148->tail;
      }
      zmsg_addstrf(local_18,"%u",(ulong)*(uint *)&local_148->head);
    }
    else if (*local_8 == '8') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_168 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_168 = local_10->frames;
        local_10->frames = (zlist_t *)&local_168->tail;
      }
      zmsg_addstrf(local_18,"%lu",local_168->head);
    }
    else if (*local_8 == 'u') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_188 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_188 = local_10->frames;
        local_10->frames = (zlist_t *)&local_188->tail;
      }
      zmsg_addstrf(local_18,"%ud",(ulong)*(uint *)&local_188->head);
    }
    else if (*local_8 == 'd') {
      if (*(uint *)&local_10->field_0x4 < 0xa1) {
        *(uint *)&local_10->field_0x4 = *(uint *)&local_10->field_0x4 + 0x10;
      }
      else {
        local_10->frames = (zlist_t *)&local_10->frames->tail;
      }
      std::__cxx11::to_string((double)in_stack_fffffffffffffd18);
      string = (char *)std::__cxx11::string::c_str();
      zmsg_addstr(pzVar4,string);
      std::__cxx11::string::~string(local_38);
    }
    else if (*local_8 == 's') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_1d0 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_1d0 = local_10->frames;
        local_10->frames = (zlist_t *)&local_1d0->tail;
      }
      local_50 = local_1d0->head;
      zmsg_addstr(local_18,(char *)local_50);
    }
    else if (*local_8 == 'b') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_1e8 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_1e8 = local_10->frames;
        local_10->frames = (zlist_t *)&local_1e8->tail;
      }
      local_58 = local_1e8->head;
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_210 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_210 = local_10->frames;
        local_10->frames = (zlist_t *)&local_210->tail;
      }
      zmsg_addmem(local_18,local_58,(long)*(int *)&local_210->head);
    }
    else if (*local_8 == 'c') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_228 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_228 = local_10->frames;
        local_10->frames = (zlist_t *)&local_228->tail;
      }
      local_60 = (zchunk_t *)local_228->head;
      pbVar2 = zchunk_data(local_60);
      sVar3 = zchunk_size(local_60);
      zmsg_addmem(pzVar4,pbVar2,sVar3);
    }
    else if (*local_8 == 'f') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_250 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_250 = local_10->frames;
        local_10->frames = (zlist_t *)&local_250->tail;
      }
      local_68 = (zframe_t *)local_250->head;
      pbVar2 = zframe_data(local_68);
      sVar3 = zframe_size(local_68);
      zmsg_addmem(pzVar4,pbVar2,sVar3);
    }
    else if (*local_8 == 'U') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_278 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_278 = local_10->frames;
        local_10->frames = (zlist_t *)&local_278->tail;
      }
      local_70 = (zuuid_t *)local_278->head;
      pbVar2 = zuuid_data(local_70);
      sVar3 = zuuid_size(local_70);
      zmsg_addmem(pzVar4,pbVar2,sVar3);
    }
    else if (*local_8 == 'p') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_2a0 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_2a0 = local_10->frames;
        local_10->frames = (zlist_t *)&local_2a0->tail;
      }
      local_78 = local_2a0->head;
      zmsg_addmem(local_18,&local_78,8);
    }
    else if (*local_8 == 'h') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_2b8 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_2b8 = local_10->frames;
        local_10->frames = (zlist_t *)&local_2b8->tail;
      }
      local_80 = (zhashx_t *)local_2b8->head;
      local_88 = zhashx_pack(local_80);
      zmsg_append(local_18,&local_88);
    }
    else if (*local_8 == 'm') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        local_2d0 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        local_2d0 = local_10->frames;
        local_10->frames = (zlist_t *)&local_2d0->tail;
      }
      local_98 = (zmsg_t *)local_2d0->head;
      local_90 = zmsg_first(local_98);
      while (local_90 != (zframe_t *)0x0) {
        local_a0 = zframe_dup(local_90);
        zmsg_append(local_18,&local_a0);
        local_90 = zmsg_next(local_98);
      }
    }
    else if (*local_8 == 'n') {
      uVar1 = local_10->tag;
      if (uVar1 < 0x29) {
        in_stack_fffffffffffffd18 = (zlist_t *)((long)(int)uVar1 + local_10->content_size);
        local_10->tag = uVar1 + 8;
      }
      else {
        in_stack_fffffffffffffd18 = local_10->frames;
        local_10->frames = (zlist_t *)&in_stack_fffffffffffffd18->tail;
      }
      pzVar4 = local_10;
      (**(code **)(**(long **)&in_stack_fffffffffffffd18->head + 0x10))();
      CZHelp::zmsg_addNDT(pzVar4,(binarydata *)in_stack_fffffffffffffd18);
      binarydata::~binarydata((binarydata *)0x3657a8);
    }
    else if (*local_8 == 'z') {
      zmsg_addmem(local_18,(void *)0x0,0);
    }
    else {
      zsys_error("zsock: invalid picture element \'%c\'",(ulong)(uint)(int)*local_8);
    }
  }
  return local_18;
}

Assistant:

zmsg_t* czhelp_zmsg_createv(const char *picture, va_list argptr){
    zmsg_t *msg = zmsg_new ();
    while (*picture) {
//        std::cerr << picture << "\n";
        if (*picture == 'i')
            zmsg_addstrf (msg, "%d", va_arg (argptr, int));
        else if (*picture == '1')
            zmsg_addstrf (msg, "%" PRIu8, (uint8_t) va_arg (argptr, int));
        else if (*picture == '2')
            zmsg_addstrf (msg, "%" PRIu16, (uint16_t) va_arg (argptr, int));
        else if (*picture == '4')
            zmsg_addstrf (msg, "%" PRIu32, va_arg (argptr, uint32_t));
        else if (*picture == '8')
            zmsg_addstrf (msg, "%" PRIu64, va_arg (argptr, uint64_t));
        else if (*picture == 'u')    //  Deprecated, use 4 or 8 instead
            zmsg_addstrf (msg, "%ud", va_arg (argptr, uint));
        else if (*picture == 'd')
            zmsg_addstr (msg, std::to_string(va_arg (argptr, double)).c_str());
        else if (*picture == 's') {
            char *str = va_arg(argptr, char *);
            zmsg_addstr (msg, str);
        }
        else if (*picture == 'b') {
            //  Note function arguments may be expanded in reverse order,
            //  so we cannot use va_arg macro twice in a single call
            byte *data = va_arg (argptr, byte *);
            zmsg_addmem (msg, data, va_arg (argptr, int));
        }
        else if (*picture == 'c') {
            zchunk_t *chunk = va_arg (argptr, zchunk_t *);
            assert (zchunk_is (chunk));
            zmsg_addmem (msg, zchunk_data (chunk), zchunk_size (chunk));
        }
        else if (*picture == 'f') {
            zframe_t *frame = va_arg (argptr, zframe_t *);
            assert (zframe_is (frame));
            zmsg_addmem (msg, zframe_data (frame), zframe_size (frame));
        }
        else if (*picture == 'U') {
            zuuid_t *uuid = va_arg (argptr, zuuid_t *);
            zmsg_addmem (msg, zuuid_data (uuid), zuuid_size (uuid));
        }
        else if (*picture == 'p') {
            void *pointer = va_arg (argptr, void *);
            zmsg_addmem (msg, &pointer, sizeof (void *));
        }
        else if (*picture == 'h') {
            zhashx_t *hash = va_arg (argptr, zhashx_t *);
            zframe_t *frame = zhashx_pack (hash);
            zmsg_append (msg, &frame);
        }
        else if (*picture == 'm') {
            zframe_t *frame;
            zmsg_t *zmsg = va_arg (argptr, zmsg_t *);
            for (frame = zmsg_first (zmsg); frame;
                    frame = zmsg_next (zmsg) ) {
                zframe_t *frame_dup = zframe_dup (frame);
                zmsg_append (msg, &frame_dup);
            }
        }
        else if (*picture == 'n') {
            NetworkDataType *val = va_arg(argptr, NetworkDataType *);
            binarydata dat = val->encode();
            CZHelp::zmsg_addNDT(msg, dat);
        }
        else if (*picture == 'z')
            zmsg_addmem (msg, NULL, 0);
        else {
            zsys_error ("zsock: invalid picture element '%c'", *picture);
            assert (false);
        }
        picture++;
    }
    return msg;
}